

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O0

void process_ircs(void)

{
  uint uVar1;
  IRR *pIVar2;
  uint j;
  uint i;
  BoolView *in_stack_00000180;
  int in_stack_00000188;
  IntRelType in_stack_0000018c;
  IntVar *in_stack_00000190;
  BoolView *in_stack_00000200;
  int in_stack_00000208;
  IntRelType in_stack_0000020c;
  IntVar *in_stack_00000210;
  vec<IRR> *in_stack_ffffffffffffff78;
  undefined1 dealloc;
  IntVar *in_stack_ffffffffffffff80;
  uint local_28;
  uint local_4;
  
  local_4 = 0;
  while( true ) {
    uVar1 = vec<IRR>::size(&ircs);
    if (uVar1 <= local_4) break;
    vec<IRR>::operator[](&ircs,local_4);
    vec<IRR>::operator[](&ircs,local_4);
    vec<IRR>::operator[](&ircs,local_4);
    vec<IRR>::operator[](&ircs,local_4);
    BoolView::BoolView((BoolView *)in_stack_ffffffffffffff80,(BoolView *)in_stack_ffffffffffffff78);
    int_rel_reif_real(in_stack_00000190,in_stack_0000018c,in_stack_00000188,in_stack_00000180);
    BoolView::~BoolView((BoolView *)0x279021);
    local_4 = local_4 + 1;
  }
  vec<IRR>::clear((vec<IRR> *)in_stack_ffffffffffffff80,
                  SUB81((ulong)in_stack_ffffffffffffff78 >> 0x38,0));
  local_28 = 0;
  while( true ) {
    dealloc = (undefined1)((ulong)in_stack_ffffffffffffff78 >> 0x38);
    uVar1 = vec<IRR>::size(&ihrcs);
    if (uVar1 <= local_28) break;
    in_stack_ffffffffffffff78 = &ihrcs;
    pIVar2 = vec<IRR>::operator[](&ihrcs,local_28);
    in_stack_ffffffffffffff80 = pIVar2->x;
    vec<IRR>::operator[](in_stack_ffffffffffffff78,local_28);
    vec<IRR>::operator[](in_stack_ffffffffffffff78,local_28);
    vec<IRR>::operator[](in_stack_ffffffffffffff78,local_28);
    BoolView::BoolView((BoolView *)in_stack_ffffffffffffff80,(BoolView *)in_stack_ffffffffffffff78);
    int_rel_half_reif_real(in_stack_00000210,in_stack_0000020c,in_stack_00000208,in_stack_00000200);
    BoolView::~BoolView((BoolView *)0x279119);
    local_28 = local_28 + 1;
  }
  vec<IRR>::clear((vec<IRR> *)in_stack_ffffffffffffff80,(bool)dealloc);
  return;
}

Assistant:

void process_ircs() {
	for (unsigned int i = 0; i < ircs.size(); i++) {
		int_rel_reif_real(ircs[i].x, ircs[i].t, ircs[i].c, ircs[i].r);
	}
	ircs.clear(true);
	for (unsigned int j = 0; j < ihrcs.size(); ++j) {
		int_rel_half_reif_real(ihrcs[j].x, ihrcs[j].t, ihrcs[j].c, ihrcs[j].r);
	}
	ihrcs.clear(true);
}